

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SongListModel.cpp
# Opt level: O0

void __thiscall SongListModel::SongListModel(SongListModel *this,Module *mod,QObject *parent)

{
  undefined1 local_60 [56];
  undefined1 local_28 [16];
  QObject *parent_local;
  Module *mod_local;
  SongListModel *this_local;
  
  local_28._8_8_ = parent;
  parent_local = &mod->super_QObject;
  mod_local = (Module *)this;
  QAbstractListModel::QAbstractListModel(&this->super_QAbstractListModel,parent);
  *(undefined ***)this = &PTR_metaObject_002d5ec8;
  this->mModule = (Module *)parent_local;
  (this->mSongData).
  super__Vector_base<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mSongData).
  super__Vector_base<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mSongData).
  super__Vector_base<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>::vector
            (&this->mSongData);
  local_60._40_8_ = Module::reloaded;
  local_60._48_8_ = 0;
  local_60._24_8_ = reload;
  local_60._32_8_ = (pointer)0x0;
  QObject::connect<void(Module::*)(),void(SongListModel::*)()>
            ((Object *)local_28,(offset_in_Module_to_subr)parent_local,(Object *)Module::reloaded,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  QObject::connect<void(Module::*)(),void(SongListModel::*)()>
            ((Object *)local_60,(offset_in_Module_to_subr)parent_local,(Object *)Module::aboutToSave
             ,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  reload(this);
  return;
}

Assistant:

SongListModel::SongListModel(Module &mod, QObject *parent) :
    QAbstractListModel(parent),
    mModule(mod),
    mSongData()
{
    connect(&mod, &Module::reloaded, this, &SongListModel::reload);
    connect(&mod, &Module::aboutToSave, this, &SongListModel::commit);
    reload();
}